

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.h
# Opt level: O2

Float __thiscall pbrt::TabulatedBSSRDF::PDF_Sr(TabulatedBSSRDF *this,int ch,Float r)

{
  float fVar1;
  float x;
  undefined8 uVar2;
  bool bVar3;
  int j;
  long lVar4;
  int i;
  long lVar5;
  Float FVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  span<float> weights;
  span<float> weights_00;
  span<const_float> nodes;
  span<const_float> nodes_00;
  float local_70;
  int rhoOffset;
  float local_64;
  float local_60;
  int radiusOffset;
  Float radiusWeights [4];
  Float rhoWeights [4];
  
  x = r * (this->sigma_t).values.values[ch];
  weights.n = 4;
  weights.ptr = rhoWeights;
  nodes.n = (this->table->rhoSamples).nStored;
  nodes.ptr = (this->table->rhoSamples).ptr;
  bVar3 = CatmullRomWeights(nodes,(this->rho).values.values[ch],&rhoOffset,weights);
  FVar6 = 0.0;
  if (bVar3) {
    weights_00.n = 4;
    weights_00.ptr = radiusWeights;
    nodes_00.n = (this->table->radiusSamples).nStored;
    nodes_00.ptr = (this->table->radiusSamples).ptr;
    bVar3 = CatmullRomWeights(nodes_00,x,&radiusOffset,weights_00);
    FVar6 = 0.0;
    if (bVar3) {
      auVar8 = ZEXT1664(ZEXT816(0) << 0x40);
      local_70 = 0.0;
      for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
        local_60 = rhoWeights[lVar5];
        auVar9 = ZEXT464((uint)local_60);
        if ((local_60 != 0.0) || (NAN(local_60))) {
          local_64 = (this->table->rhoEff).ptr[(long)(int)lVar5 + (long)rhoOffset];
          for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
            if ((radiusWeights[lVar4] != 0.0) || (NAN(radiusWeights[lVar4]))) {
              FVar6 = BSSRDFTable::EvalProfile
                                (this->table,rhoOffset + (int)lVar5,radiusOffset + (int)lVar4);
              auVar9 = ZEXT464((uint)local_60);
              auVar7 = vfmadd231ss_fma(auVar8._0_16_,ZEXT416((uint)(FVar6 * rhoWeights[lVar5])),
                                       ZEXT416((uint)radiusWeights[lVar4]));
              auVar8 = ZEXT1664(auVar7);
            }
          }
          auVar7 = vfmadd231ss_fma(ZEXT416((uint)local_70),auVar9._0_16_,ZEXT416((uint)local_64));
          local_70 = auVar7._0_4_;
        }
      }
      uVar2 = vcmpss_avx512f(ZEXT416((uint)x),ZEXT816(0) << 0x40,4);
      bVar3 = (bool)((byte)uVar2 & 1);
      fVar1 = (this->sigma_t).values.values[ch];
      auVar7._0_4_ = (fVar1 * (float)((uint)bVar3 * (int)(auVar8._0_4_ / (x * 6.2831855)) +
                                     (uint)!bVar3 * (int)auVar8._0_4_) * fVar1) / local_70;
      auVar7._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar7 = vmaxss_avx(auVar7,ZEXT816(0) << 0x40);
      FVar6 = auVar7._0_4_;
    }
  }
  return FVar6;
}

Assistant:

PBRT_CPU_GPU
    Float PDF_Sr(int ch, Float r) const {
        // Convert $r$ into unitless optical radius $r_{\roman{optical}}$
        Float rOptical = r * sigma_t[ch];

        // Compute spline weights to interpolate BSSRDF density on channel _ch_
        int rhoOffset, radiusOffset;
        Float rhoWeights[4], radiusWeights[4];
        if (!CatmullRomWeights(table->rhoSamples, rho[ch], &rhoOffset, rhoWeights) ||
            !CatmullRomWeights(table->radiusSamples, rOptical, &radiusOffset,
                               radiusWeights))
            return 0.f;

        // Return BSSRDF profile density for channel _ch_
        Float sr = 0, rhoEff = 0;
        for (int i = 0; i < 4; ++i) {
            if (rhoWeights[i] == 0)
                continue;
            rhoEff += table->rhoEff[rhoOffset + i] * rhoWeights[i];
            for (int j = 0; j < 4; ++j) {
                if (radiusWeights[j] == 0)
                    continue;
                sr += table->EvalProfile(rhoOffset + i, radiusOffset + j) *
                      rhoWeights[i] * radiusWeights[j];
            }
        }
        // Cancel marginal PDF factor from tabulated BSSRDF profile
        if (rOptical != 0)
            sr /= 2 * Pi * rOptical;

        return std::max<Float>(0, sr * sigma_t[ch] * sigma_t[ch] / rhoEff);
    }